

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::computeViewOrdering(CppGenerator *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  undefined8 *puVar1;
  uint uVar2;
  pointer ppAVar3;
  Aggregate *pAVar4;
  element_type *peVar5;
  value_type_conflict2 *pvVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  CppGenerator *pCVar9;
  size_t sVar10;
  ulong uVar11;
  size_t *psVar12;
  pointer puVar13;
  View *pVVar14;
  TDNode *pTVar15;
  size_t __n;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t *nodeID;
  long lVar19;
  pointer puVar20;
  size_t i;
  size_t *incView;
  ulong *puVar21;
  uint uVar22;
  long lVar23;
  size_t *destView;
  value_type_conflict2 *pvVar24;
  size_t *viewID;
  long lVar25;
  bool bVar26;
  reference rVar27;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  allocator_type local_141;
  CppGenerator *local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> orderedViewList;
  size_t viewID_1;
  unsigned_long local_108;
  dyn_bitset processedViews;
  dyn_bitset queuedViews;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  viewsPerNode;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> nodesToProcess;
  
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar10;
  uVar11 = SUB168(auVar8 * ZEXT816(0x18),0);
  uVar17 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar17 = 0xffffffffffffffff;
  }
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
    uVar11 = uVar17;
  }
  psVar12 = (size_t *)operator_new__(uVar11);
  *psVar12 = sVar10;
  if (sVar10 != 0) {
    lVar16 = 0;
    do {
      *(undefined8 *)((long)psVar12 + lVar16 + 0x18) = 0;
      puVar1 = (undefined8 *)
               ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar12 + 1))->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar16);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar16 = lVar16 + 0x18;
    } while (sVar10 * 0x18 - lVar16 != 0);
  }
  this->incomingViews = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar12 + 1);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  psVar12 = (size_t *)operator_new__(-(ulong)(sVar10 >> 0x3d != 0) | sVar10 * 8);
  this->viewToGroupMapping = psVar12;
  sVar10 = TreeDecomposition::numberOfRelations
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&viewsPerNode,sVar10,(value_type *)&nodesToProcess,(allocator_type *)&processedViews);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nodesToProcess);
  puVar20 = (pointer)0x0;
  local_140 = this;
  while( true ) {
    processedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = puVar20;
    puVar13 = (pointer)QueryCompiler::numberOfViews
                                 ((this->_qc).
                                  super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
    if (puVar13 <= puVar20) break;
    pVVar14 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(size_t)processedViews.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
    pTVar15 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar14->_origin);
    uVar2 = pVVar14->_origin;
    uVar22 = pVVar14->_destination;
    sVar10 = pTVar15->_numOfNeighbors;
    __n = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&nodesToProcess,__n,
               (allocator_type *)&queuedViews);
    lVar16 = sVar10 - (uVar2 != uVar22);
    for (uVar17 = 0; this = local_140,
        ppAVar3 = (pVVar14->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(pVVar14->_aggregates).
                               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)ppAVar3 >> 3);
        uVar17 = uVar17 + 1) {
      pAVar4 = ppAVar3[uVar17];
      lVar25 = 0;
      for (uVar11 = 0; lVar19 = lVar25, lVar23 = lVar16,
          uVar11 < (ulong)(((long)*(pointer *)
                                   ((long)&(pAVar4->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl + 8) -
                           *(long *)&(pAVar4->_agg).
                                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                     ._M_impl) / 0xc0); uVar11 = uVar11 + 1) {
        while (bVar26 = lVar23 != 0, lVar23 = lVar23 + -1, bVar26) {
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&nodesToProcess,
                              *(size_type *)
                               (*(long *)&(pAVar4->_incoming).
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data + lVar19));
          *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
          lVar19 = lVar19 + 0x10;
        }
        lVar25 = lVar25 + lVar16 * 0x10;
      }
    }
    puVar20 = (pointer)0x0;
    while( true ) {
      queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar20;
      puVar13 = (pointer)QueryCompiler::numberOfViews
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
      if (puVar13 <= puVar20) break;
      rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&nodesToProcess,
                          (size_type)
                          queuedViews.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
      if ((*rVar27._M_p & rVar27._M_mask) != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (this->incomingViews +
                   (long)processedViews.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,(value_type_conflict2 *)&queuedViews);
      }
      puVar20 = (pointer)((long)queuedViews.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (viewsPerNode.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pVVar14->_origin,
               (value_type_conflict2 *)&processedViews);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&nodesToProcess);
    puVar20 = (pointer)((long)processedViews.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
  }
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&processedViews,sVar10,0,(allocator<unsigned_long> *)&nodesToProcess);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&queuedViews,sVar10,0,(allocator<unsigned_long> *)&nodesToProcess);
  orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(&nodesToProcess);
  peVar5 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar13 = (peVar5->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (peVar5->_leafNodes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar13; puVar20 = puVar20 + 1) {
    pvVar6 = viewsPerNode.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*puVar20].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pvVar24 = viewsPerNode.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[*puVar20].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; pvVar24 != pvVar6; pvVar24 = pvVar24 + 1) {
      uVar17 = *pvVar24;
      if (local_140->incomingViews[uVar17].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140->incomingViews[uVar17].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[uVar17 >> 6] =
             queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar17 >> 6] | 1L << ((byte)uVar17 & 0x3f);
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&nodesToProcess.c,pvVar24);
      }
    }
  }
  do {
    pCVar9 = local_140;
    if (nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pVVar14 = QueryCompiler::getView
                          ((local_140->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           *orderedViewList.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar22 = pVVar14->_origin;
      local_108 = *orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      __l._M_len = 1;
      __l._M_array = &local_108;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1,__l,&local_141);
      this_00 = &pCVar9->viewGroups;
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1);
      pCVar9->viewToGroupMapping
      [*orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start] = 0;
      lVar16 = 8;
      sVar10 = 0;
      for (uVar17 = 1;
          uVar17 < (ulong)((long)orderedViewList.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)orderedViewList.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar17 = uVar17 + 1
          ) {
        pVVar14 = QueryCompiler::getView
                            ((local_140->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             *(size_t *)
                              ((long)orderedViewList.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar16));
        uVar2 = pVVar14->_origin;
        if ((multifaq::cppgen::MULTI_OUTPUT == '\x01') && (uVar22 == uVar2)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((this_00->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + sVar10,
                     (value_type_conflict2 *)
                     ((long)orderedViewList.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar16));
        }
        else {
          local_108 = *(unsigned_long *)
                       ((long)orderedViewList.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar16);
          __l_00._M_len = 1;
          __l_00._M_array = &local_108;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1,__l_00,
                     &local_141);
          std::
          vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      *)this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&viewID_1);
          sVar10 = sVar10 + 1;
        }
        local_140->viewToGroupMapping
        [*(long *)((long)orderedViewList.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar16)] = sVar10;
        lVar16 = lVar16 + 8;
        uVar22 = uVar2;
      }
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nodesToProcess);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&orderedViewList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
      ;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&queuedViews);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&processedViews);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&viewsPerNode);
      return;
    }
    viewID_1 = *nodesToProcess.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&nodesToProcess.c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&orderedViewList,&viewID_1);
    processedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[viewID_1 >> 6] =
         processedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[viewID_1 >> 6] | 1L << ((byte)viewID_1 & 0x3f);
    pVVar14 = QueryCompiler::getView
                        ((local_140->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         viewID_1);
    pvVar6 = viewsPerNode.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[pVVar14->_destination].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pvVar24 = viewsPerNode.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[pVVar14->_destination].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; pvVar24 != pvVar6; pvVar24 = pvVar24 + 1) {
      uVar17 = *pvVar24;
      uVar18 = 1L << ((byte)uVar17 & 0x3f);
      uVar11 = uVar17 >> 6;
      if ((processedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar11] >> (uVar17 & 0x3f) & 1) == 0) {
        for (puVar21 = local_140->incomingViews[uVar17].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            puVar21 !=
            local_140->incomingViews[uVar17].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; puVar21 = puVar21 + 1) {
          uVar7 = *puVar21;
          if (((processedViews.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) &&
             ((queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7 >> 6] & 1L << ((byte)uVar7 & 0x3f)) ==
              0)) goto LAB_001aa3ba;
        }
        if ((queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11] & uVar18) == 0) {
          queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11] =
               queuedViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11] | uVar18;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&nodesToProcess.c,pvVar24);
        }
      }
LAB_001aa3ba:
    }
  } while( true );
}

Assistant:

void CppGenerator::computeViewOrdering()
{
    incomingViews = new std::vector<size_t>[_qc->numberOfViews()]();
    viewToGroupMapping = new size_t[_qc->numberOfViews()];

    std::vector<std::vector<size_t>> viewsPerNode(
        _td->numberOfRelations(), std::vector<size_t>());
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        TDNode* baseRelation = _td->getRelation(view->_origin);
        
        size_t numberIncomingViews =
            (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
             baseRelation->_numOfNeighbors - 1);
        
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = view->_aggregates[aggNo];

            size_t incOffset = 0;
            // First find the all views that contribute to this Aggregate
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                for (size_t j = 0; j < numberIncomingViews; ++j)
                {
                    const size_t& incViewID = aggregate->_incoming[incOffset].first;
               
                    // Indicate that this view contributes to some aggregate
                    incViewBitset[incViewID] = 1;
                    ++incOffset;
                }
            }
        }        
        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
            if (incViewBitset[incViewID])
                incomingViews[viewID].push_back(incViewID);

        // Keep track of the views that origin from this node 
        viewsPerNode[view->_origin].push_back(viewID);
    }
    
    /* Next compute the topological order of the views */
    dyn_bitset processedViews(_qc->numberOfViews());
    dyn_bitset queuedViews(_qc->numberOfViews());
    
    // create orderedViewList -> which is empty
    std::vector<size_t> orderedViewList;
    std::queue<size_t> nodesToProcess;
    
    // Find all views that originate from leaf nodes
    for (const size_t& nodeID : _td->_leafNodes)
    {
        for (const size_t& viewID : viewsPerNode[nodeID])
        {
            if (incomingViews[viewID].size() == 0)
            {
                queuedViews.set(viewID);
                nodesToProcess.push(viewID);
            }
        }
    }
    
    while (!nodesToProcess.empty()) // there is a node in the set
    {
        size_t viewID = nodesToProcess.front();
        nodesToProcess.pop();

        orderedViewList.push_back(viewID);
        processedViews.set(viewID);

        const size_t& destination = _qc->getView(viewID)->_destination;

        // For each view that has the same destination 
        for (const size_t& destView : viewsPerNode[destination])
        {
            // check if this has not been processed (case for root nodes)
            if (!processedViews[destView])
            {
                bool candidate = true;
                for (const size_t& incView : incomingViews[destView])
                {    
                    if (!processedViews[incView] && !queuedViews[incView])
                    {
                        candidate = false;
                        break;
                    }
                }
                
                if (candidate && !queuedViews[destView])
                {
                    queuedViews.set(destView);
                    nodesToProcess.push(destView);
                }
            }
        }
    }

    /* Now generate the groups of views according to topological order*/
    size_t prevOrigin = _qc->getView(orderedViewList[0])->_origin;
    viewGroups.push_back({orderedViewList[0]});

    viewToGroupMapping[orderedViewList[0]] = 0;    
    size_t currentGroup = 0;
    for (size_t viewID = 1; viewID < orderedViewList.size(); ++viewID)
    {
        size_t origin = _qc->getView(orderedViewList[viewID])->_origin;
        if (MULTI_OUTPUT && prevOrigin == origin)
        {
            // Combine the two into one set of
            viewGroups[currentGroup].push_back(orderedViewList[viewID]);
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        else
        {
            // Create a new group
            viewGroups.push_back({orderedViewList[viewID]});
            ++currentGroup;
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        prevOrigin = origin;
    }

    /**************** PRINT OUT **********************/
    DINFO("Ordered View List: ");
    for (size_t& i : orderedViewList)
        DINFO(i << ", ");
    DINFO(std::endl);
    DINFO("View Groups: ");
    for (auto& group : viewGroups) {
        for (auto& i : group)
            DINFO(i << "  ");
        DINFO("|");
    }
    DINFO(std::endl);
    /**************** PRINT OUT **********************/
}